

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fNew;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  uint fMiter;
  char *pcVar4;
  uint fVerbose;
  uint local_5c;
  uint local_58;
  uint local_54;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fNew = 0;
  Extra_UtilGetoptReset();
  fMiter = 1;
  local_54 = 0x1e;
  local_58 = 8;
  local_5c = 0x20;
  fVerbose = 0;
  pcVar4 = (char *)0x0;
LAB_0021b032:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FWTAnmvh"), iVar3 = globalUtilOptind, iVar1 == 0x41)
    {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by a file name.\n";
LAB_0021b19c:
        Abc_Print(-1,pcVar4);
        goto LAB_0021b1a8;
      }
      pcVar4 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (0x56 < iVar1) {
      if (iVar1 < 0x6e) {
        if (iVar1 == 0x57) {
          if (globalUtilOptind < argc) {
            local_58 = atoi(argv[globalUtilOptind]);
            uVar2 = local_58;
            goto joined_r0x0021b14d;
          }
          pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_0021b19c;
        }
        if (iVar1 != 0x6d) goto LAB_0021b1a8;
        fMiter = fMiter ^ 1;
      }
      else if (iVar1 == 0x6e) {
        fNew = fNew ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0021b1a8;
        fVerbose = fVerbose ^ 1;
      }
      goto LAB_0021b032;
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else if (pNtk->ntkType == ABC_NTK_STRASH) {
        if ((pcVar4 == (char *)0x0) || (pNtk->nObjCounts[8] == 0)) {
          if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
            free(pNtk->pSeqModel);
            pNtk->pSeqModel = (Abc_Cex_t *)0x0;
          }
          iVar3 = Abc_NtkDarSeqSim(pNtk,local_5c,local_58,local_54,fNew,fMiter,fVerbose,pcVar4);
          pAbc->Status = iVar3;
          Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
          return 0;
        }
        pcVar4 = "Currently simulation with user-specified patterns works only for comb miters.\n";
      }
      else {
        pcVar4 = "Only works for strashed networks.\n";
      }
      iVar3 = -1;
      goto LAB_0021b2d5;
    }
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0021b19c;
      }
      local_5c = atoi(argv[globalUtilOptind]);
      uVar2 = local_5c;
    }
    else {
      if (iVar1 != 0x54) goto LAB_0021b1a8;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0021b19c;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
    }
joined_r0x0021b14d:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0021b1a8:
      Abc_Print(-2,"usage: sim [-FWT num] [-A file] [-nmvh]\n");
      Abc_Print(-2,"\t          performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num  : the number of frames to simulate [default = %d]\n",(ulong)local_5c);
      Abc_Print(-2,"\t-W num  : the number of words to simulate [default = %d]\n",(ulong)local_58);
      Abc_Print(-2,"\t-T num  : approximate runtime limit in seconds [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,
                "\t-A file : text file name with user\'s patterns [default = random simulation]\n");
      Abc_Print(-2,"\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n");
      pcVar4 = "new";
      if (fNew == 0) {
        pcVar4 = "old";
      }
      Abc_Print(-2,"\t-n      : toggle new vs. old implementation [default = %s]\n",pcVar4);
      pcVar4 = "miter";
      if (fMiter == 0) {
        pcVar4 = "circuit";
      }
      Abc_Print(-2,"\t-m      : toggle miter vs. any circuit [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h      : print the command usage\n";
      iVar3 = -2;
LAB_0021b2d5:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fNew;
    int fComb;
    int nFrames;
    int nWords;
    int TimeOut;
    int fMiter;
    int fVerbose;
    char * pFileSim;
    extern int Abc_NtkDarSeqSim( Abc_Ntk_t * pNtk, int nFrames, int nWords, int TimeOut, int fNew, int fMiter, int fVerbose, char * pFileSim );
    // set defaults
    fNew       =  0;
    fComb      =  0;
    nFrames    = 32;
    nWords     =  8;
    TimeOut    = 30;
    fMiter     =  1;
    fVerbose   =  0;
    pFileSim   = NULL;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTAnmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileSim = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'n':
            fNew ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( pFileSim != NULL && Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "Currently simulation with user-specified patterns works only for comb miters.\n" );
        return 1;
    }
    ABC_FREE( pNtk->pSeqModel );
    pAbc->Status = Abc_NtkDarSeqSim( pNtk, nFrames, nWords, TimeOut, fNew, fMiter, fVerbose, pFileSim );
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    return 0;

usage:
    Abc_Print( -2, "usage: sim [-FWT num] [-A file] [-nmvh]\n" );
    Abc_Print( -2, "\t          performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num  : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-W num  : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-T num  : approximate runtime limit in seconds [default = %d]\n", TimeOut );
    Abc_Print( -2, "\t-A file : text file name with user's patterns [default = random simulation]\n" );
    Abc_Print( -2, "\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n" );
    Abc_Print( -2, "\t-n      : toggle new vs. old implementation [default = %s]\n", fNew? "new": "old" );
    Abc_Print( -2, "\t-m      : toggle miter vs. any circuit [default = %s]\n", fMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}